

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_worker_ctor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSAtom atom;
  int iVar1;
  JSRuntime *rt;
  void *pvVar2;
  char *__s;
  undefined8 *__arg;
  char *pcVar3;
  JSWorkerMessagePipe *pJVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  char *pcVar7;
  int64_t iVar8;
  JSRefCountHeader *p;
  JSValueUnion JVar9;
  JSValue JVar10;
  JSValue JVar11;
  pthread_t tid;
  pthread_attr_t attr;
  pthread_t local_70;
  pthread_attr_t local_68;
  
  rt = JS_GetRuntime(ctx);
  pvVar2 = JS_GetRuntimeOpaque(rt);
  if (*(long *)((long)pvVar2 + 0x48) == 0) {
    atom = JS_GetScriptOrModuleName(ctx,1);
    if (atom == 0) {
      pcVar7 = "could not determine calling script or module name";
      goto LAB_00111a83;
    }
    pcVar7 = JS_AtomToCString(ctx,atom);
    JS_FreeAtom(ctx,atom);
    if ((pcVar7 == (char *)0x0) ||
       (__s = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0), __s == (char *)0x0)) {
      __s = (char *)0x0;
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
      __arg = (undefined8 *)0x0;
      goto LAB_00111c0c;
    }
    __arg = (undefined8 *)calloc(1,0x20);
    if (__arg == (undefined8 *)0x0) {
LAB_00111bf4:
      JS_ThrowOutOfMemory(ctx);
      JVar10 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00111c0c:
      JS_FreeCString(ctx,pcVar7);
      JS_FreeCString(ctx,__s);
      if (__arg != (undefined8 *)0x0) {
        free((void *)*__arg);
        free((void *)__arg[1]);
        js_free_message_pipe((JSWorkerMessagePipe *)__arg[2]);
        js_free_message_pipe((JSWorkerMessagePipe *)__arg[3]);
        free(__arg);
      }
      if ((0xfffffff4 < (uint)JVar10.tag) &&
         (iVar1 = *JVar10.u.ptr, *(int *)JVar10.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValue(ctx,JVar10);
      }
      JVar9.float64 = 0.0;
      uVar6 = 0;
      iVar8 = 6;
      goto LAB_00111c82;
    }
    pcVar3 = strdup(__s);
    *__arg = pcVar3;
    pcVar3 = strdup(pcVar7);
    __arg[1] = pcVar3;
    pJVar4 = js_new_message_pipe();
    __arg[2] = pJVar4;
    if (pJVar4 == (JSWorkerMessagePipe *)0x0) goto LAB_00111bf4;
    pJVar4 = js_new_message_pipe();
    __arg[3] = pJVar4;
    if (pJVar4 == (JSWorkerMessagePipe *)0x0) goto LAB_00111bf4;
    JVar10 = js_worker_ctor_internal(ctx,new_target,pJVar4,(JSWorkerMessagePipe *)__arg[2]);
    JVar5 = JVar10.u;
    if ((int)JVar10.tag == 6) goto LAB_00111c0c;
    pthread_attr_init(&local_68);
    pthread_attr_setdetachstate(&local_68,1);
    iVar1 = pthread_create(&local_70,&local_68,worker_func,__arg);
    pthread_attr_destroy(&local_68);
    if (iVar1 != 0) {
      JS_ThrowTypeError(ctx,"could not create worker");
      goto LAB_00111c0c;
    }
    JS_FreeCString(ctx,pcVar7);
    JS_FreeCString(ctx,__s);
    JVar10.tag = JVar10.tag;
    JVar10.u.float64 = -NAN;
    JVar9 = JVar5;
  }
  else {
    pcVar7 = "cannot create a worker inside a worker";
LAB_00111a83:
    JVar10 = JS_ThrowTypeError(ctx,pcVar7);
    JVar5.float64 = -NAN;
    JVar9 = JVar10.u;
  }
  iVar8 = JVar10.tag;
  uVar6 = (ulong)JVar5.ptr & (ulong)JVar10.u.ptr;
LAB_00111c82:
  JVar11.u.ptr = (void *)((ulong)JVar9.ptr & 0xffffffff | uVar6);
  JVar11.tag = iVar8;
  return JVar11;
}

Assistant:

static JSValue js_worker_ctor(JSContext *ctx, JSValueConst new_target,
                              int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    WorkerFuncArgs *args = NULL;
    pthread_t tid;
    pthread_attr_t attr;
    JSValue obj = JS_UNDEFINED;
    int ret;
    const char *filename = NULL, *basename;
    JSAtom basename_atom;
    
    /* XXX: in order to avoid problems with resource liberation, we
       don't support creating workers inside workers */
    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "cannot create a worker inside a worker");

    /* base name, assuming the calling function is a normal JS
       function */
    basename_atom = JS_GetScriptOrModuleName(ctx, 1);
    if (basename_atom == JS_ATOM_NULL) {
        return JS_ThrowTypeError(ctx, "could not determine calling script or module name");
    }
    basename = JS_AtomToCString(ctx, basename_atom);
    JS_FreeAtom(ctx, basename_atom);
    if (!basename)
        goto fail;
    
    /* module name */
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;

    args = malloc(sizeof(*args));
    if (!args)
        goto oom_fail;
    memset(args, 0, sizeof(*args));
    args->filename = strdup(filename);
    args->basename = strdup(basename);

    /* ports */
    args->recv_pipe = js_new_message_pipe();
    if (!args->recv_pipe)
        goto oom_fail;
    args->send_pipe = js_new_message_pipe();
    if (!args->send_pipe)
        goto oom_fail;

    obj = js_worker_ctor_internal(ctx, new_target,
                                  args->send_pipe, args->recv_pipe);
    if (JS_IsException(obj))
        goto fail;
    
    pthread_attr_init(&attr);
    /* no join at the end */
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED);
    ret = pthread_create(&tid, &attr, worker_func, args);
    pthread_attr_destroy(&attr);
    if (ret != 0) {
        JS_ThrowTypeError(ctx, "could not create worker");
        goto fail;
    }
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    return obj;
 oom_fail:
    JS_ThrowOutOfMemory(ctx);
 fail:
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    if (args) {
        free(args->filename);
        free(args->basename);
        js_free_message_pipe(args->recv_pipe);
        js_free_message_pipe(args->send_pipe);
        free(args);
    }
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}